

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O1

Vec_Int_t * Aig_ManPartitionDfs(Aig_Man_t *p,int nPartSize,int fPreorder)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  ulong uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  Vec_Ptr_t *__ptr;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  iVar1 = p->vObjs->nSize;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  if (fPreorder == 0) {
    __ptr = Aig_ManDfs(p,1);
    iVar7 = __ptr->nSize;
    lVar9 = (long)iVar7;
    if (0 < lVar9) {
      iVar5 = 0;
      do {
        if (__ptr->nSize < lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar2 = *(int *)((long)__ptr->pArray[lVar9 + -1] + 0x24);
        if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_006c79d9;
        __s[iVar2] = iVar5 / nPartSize;
        iVar5 = iVar5 + 1;
        lVar9 = lVar9 + -1;
      } while (iVar7 != iVar5);
    }
  }
  else {
    __ptr = Aig_ManDfsPreorder(p,1);
    if (0 < __ptr->nSize) {
      ppvVar3 = __ptr->pArray;
      uVar8 = 0;
      do {
        iVar7 = *(int *)((long)ppvVar3[uVar8] + 0x24);
        if (((long)iVar7 < 0) || (iVar1 <= iVar7)) {
LAB_006c79d9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iVar5 = (int)uVar8;
        uVar4 = uVar8 & 0xffffffff;
        uVar8 = uVar8 + 1;
        __s[iVar7] = (int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar4) / (long)nPartSize);
      } while ((long)uVar8 < (long)__ptr->nSize);
    }
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Aig_ManPartitionDfs( Aig_Man_t * p, int nPartSize, int fPreorder )
{
    Vec_Int_t * vId2Part; 
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    if ( fPreorder )
    {
        vNodes = Aig_ManDfsPreorder( p, 1 );
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
            Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    }
    else
    {
        vNodes = Aig_ManDfs( p, 1 );
        Vec_PtrForEachEntryReverse( Aig_Obj_t *, vNodes, pObj, i )
            Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    }
    Vec_PtrFree( vNodes );
    return vId2Part;
}